

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimalControlProblem.cpp
# Opt level: O0

bool __thiscall
iDynTree::optimalcontrol::OptimalControlProblem::addLagrangeTerm
          (OptimalControlProblem *this,double weight,double startingTime,double finalTime,
          shared_ptr<iDynTree::optimalcontrol::QuadraticCost> *quadraticCost)

{
  bool bVar1;
  ostream *poVar2;
  Cost *this_00;
  string *psVar3;
  char *pcVar4;
  char *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  ostringstream errorMsg;
  TimeRange timeRange;
  string *in_stack_00000440;
  undefined1 in_stack_0000044e;
  undefined1 in_stack_0000044f;
  shared_ptr<iDynTree::optimalcontrol::Cost> *in_stack_00000450;
  TimeRange *in_stack_00000458;
  double in_stack_00000460;
  OptimalControlProblemPimpl *in_stack_00000468;
  undefined7 in_stack_fffffffffffffd88;
  undefined1 in_stack_fffffffffffffd8f;
  double in_stack_fffffffffffffd90;
  TimeRange *in_stack_fffffffffffffd98;
  allocator<char> *in_stack_fffffffffffffdc0;
  allocator<char> local_221;
  string local_220 [48];
  string local_1f0 [48];
  ostringstream local_1c0 [376];
  TimeRange local_48 [2];
  byte local_1;
  
  TimeRange::TimeRange(local_48);
  bVar1 = TimeRange::setTimeInterval
                    (in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,
                     (double)CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88));
  if (bVar1) {
    std::shared_ptr<iDynTree::optimalcontrol::Cost>::
    shared_ptr<iDynTree::optimalcontrol::QuadraticCost,void>
              (*(shared_ptr<iDynTree::optimalcontrol::Cost> **)in_RDI,
               (shared_ptr<iDynTree::optimalcontrol::QuadraticCost> *)
               CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(in_RDI,in_RSI,in_stack_fffffffffffffdc0);
    local_1 = OptimalControlProblemPimpl::addCost
                        (in_stack_00000468,in_stack_00000460,in_stack_00000458,in_stack_00000450,
                         (bool)in_stack_0000044f,(bool)in_stack_0000044e,in_stack_00000440);
    std::__cxx11::string::~string(local_220);
    std::allocator<char>::~allocator(&local_221);
    std::shared_ptr<iDynTree::optimalcontrol::Cost>::~shared_ptr
              ((shared_ptr<iDynTree::optimalcontrol::Cost> *)0x2fb35d);
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_1c0);
    poVar2 = std::operator<<((ostream *)local_1c0,"The cost named ");
    this_00 = (Cost *)std::
                      __shared_ptr_access<iDynTree::optimalcontrol::QuadraticCost,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::QuadraticCost,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x2fb1cc);
    psVar3 = Cost::name_abi_cxx11_(this_00);
    poVar2 = std::operator<<(poVar2,(string *)psVar3);
    std::operator<<(poVar2," has invalid time settings.");
    std::__cxx11::ostringstream::str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    iDynTree::reportError("OptimalControlProblem","addLagrangeTerm",pcVar4);
    std::__cxx11::string::~string(local_1f0);
    local_1 = 0;
    std::__cxx11::ostringstream::~ostringstream(local_1c0);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool OptimalControlProblem::addLagrangeTerm(double weight, double startingTime, double finalTime, std::shared_ptr<QuadraticCost> quadraticCost)
        {
            TimeRange timeRange;

            if (!timeRange.setTimeInterval(startingTime, finalTime)){
                std::ostringstream errorMsg;
                errorMsg << "The cost named " << quadraticCost->name() <<" has invalid time settings.";
                reportError("OptimalControlProblem", "addLagrangeTerm", errorMsg.str().c_str());
                return false;
            }

            return (m_pimpl->addCost(weight, timeRange, quadraticCost, false, true, "addLagrangeTerm"));
        }